

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

void ly_load_plugins_dir(DIR *dir,char *dir_path,int ext_or_type)

{
  int iVar1;
  int iVar2;
  dirent *pdVar3;
  size_t sVar4;
  void *node;
  char *pcVar5;
  lytype_plugin_list *plugin;
  long lVar6;
  int *piVar7;
  undefined8 uVar8;
  char **ppcVar9;
  ushort uVar10;
  char *pcVar11;
  char *local_38;
  char *str;
  
LAB_0016a901:
  do {
    while( true ) {
      do {
        pdVar3 = readdir((DIR *)dir);
        if (pdVar3 == (dirent *)0x0) {
          return;
        }
        pcVar5 = pdVar3->d_name;
        sVar4 = strlen(pcVar5);
      } while ((sVar4 < 4) || (iVar1 = strcmp(pcVar5 + (sVar4 - 3),".so"), iVar1 != 0));
      iVar1 = asprintf(&local_38,"%s/%s",dir_path,pcVar5);
      if (iVar1 == -1) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "ly_load_plugins_dir");
        return;
      }
      node = (void *)dlopen();
      pcVar11 = local_38;
      if (node != (void *)0x0) break;
      uVar8 = dlerror();
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Loading \"%s\" as a plugin failed (%s).",pcVar11,uVar8)
      ;
LAB_0016ab4a:
      free(local_38);
    }
    iVar1 = ly_set_contains(&dlhandlers,node);
    if (iVar1 != -1) {
      ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" already loaded.",local_38);
      free(local_38);
      dlclose(node);
      goto LAB_0016a901;
    }
    dlerror();
    pcVar5 = strndup(pcVar5,sVar4 - 3);
    if (pcVar5 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_load_plugins_dir"
            );
      dlclose(node);
      free(local_38);
      return;
    }
    plugin = (lytype_plugin_list *)dlsym();
    lVar6 = dlerror();
    if (ext_or_type == 0) {
      if (lVar6 != 0) {
        pcVar11 = "Processing \"%s\" user type plugin failed, missing plugin list object (%s).";
        goto LAB_0016a9f5;
      }
      piVar7 = (int *)dlsym(node,"lytype_api_version");
      lVar6 = dlerror();
      if (lVar6 == 0) {
        iVar1 = *piVar7;
        if (iVar1 == 1) {
          iVar2 = ly_register_types(plugin,pcVar5);
          goto LAB_0016aa98;
        }
      }
      else if (piVar7 == (int *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = *piVar7;
      }
      pcVar11 = 
      "Processing \"%s\" user type plugin failed, wrong API version - %d expected, %d found.";
LAB_0016aabb:
      iVar2 = 1;
      ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,pcVar11,pcVar5,1,iVar1);
    }
    else {
      if (lVar6 == 0) {
        piVar7 = (int *)dlsym(node,"lyext_api_version");
        lVar6 = dlerror();
        if (lVar6 == 0) {
          iVar1 = *piVar7;
          if (iVar1 == 1) {
            iVar2 = ly_register_exts((lyext_plugin_list *)plugin,pcVar5);
LAB_0016aa98:
            if (iVar2 == 0) {
              ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Plugin \"%s\" successfully loaded.",local_38
                    );
              ppcVar9 = (char **)ly_realloc(loaded_plugins,(ulong)loaded_plugins_count * 8 + 0x10);
              loaded_plugins = ppcVar9;
              if (ppcVar9 == (char **)0x0) {
                free(pcVar5);
                ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "ly_add_loaded_plugin");
              }
              else {
                uVar10 = loaded_plugins_count + 1;
                loaded_plugins_count = uVar10;
                ppcVar9[(ulong)uVar10 - 1] = pcVar5;
                ppcVar9[uVar10] = (char *)0x0;
              }
              ly_set_add(&dlhandlers,node,1);
              goto LAB_0016ab4a;
            }
            goto LAB_0016aac8;
          }
        }
        else if (piVar7 == (int *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = *piVar7;
        }
        pcVar11 = 
        "Processing \"%s\" extension plugin failed, wrong API version - %d expected, %d found.";
        goto LAB_0016aabb;
      }
      pcVar11 = "Processing \"%s\" extension plugin failed, missing plugin list object (%s).";
LAB_0016a9f5:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,pcVar11,pcVar5,lVar6);
      iVar2 = 1;
    }
LAB_0016aac8:
    free(pcVar5);
    dlclose(node);
    free(local_38);
    if (iVar2 == -1) {
      return;
    }
  } while( true );
}

Assistant:

static void
ly_load_plugins_dir(DIR *dir, const char *dir_path, int ext_or_type)
{
    struct dirent *file;
    size_t len;
    char *str, *name;
    void *dlhandler;
    int ret;

#ifdef STATIC
    return;
#endif /* STATIC */

    while ((file = readdir(dir))) {
        /* required format of the filename is *LY_PLUGIN_SUFFIX */
        len = strlen(file->d_name);
        if (len < LY_PLUGIN_SUFFIX_LEN + 1 ||
                strcmp(&file->d_name[len - LY_PLUGIN_SUFFIX_LEN], LY_PLUGIN_SUFFIX)) {
            continue;
        }

        /* and construct the filepath */
        if (asprintf(&str, "%s/%s", dir_path, file->d_name) == -1) {
            LOGMEM(NULL);
            return;
        }

        /* load the plugin */
        dlhandler = dlopen(str, RTLD_NOW);
        if (!dlhandler) {
            LOGERR(NULL, LY_ESYS, "Loading \"%s\" as a plugin failed (%s).", str, dlerror());
            free(str);
            continue;
        }
        if (ly_set_contains(&dlhandlers, dlhandler) != -1) {
            /* the plugin is already loaded */
            LOGVRB("Plugin \"%s\" already loaded.", str);
            free(str);

            /* keep the refcount of the shared object correct */
            dlclose(dlhandler);
            continue;
        }
        dlerror();    /* Clear any existing error */

        /* store the name without the suffix */
        name = strndup(file->d_name, len - LY_PLUGIN_SUFFIX_LEN);
        if (!name) {
            LOGMEM(NULL);
            dlclose(dlhandler);
            free(str);
            return;
        }

        if (ext_or_type) {
            ret = lyext_load_plugin(dlhandler, name);
        } else {
            ret = lytype_load_plugin(dlhandler, name);
        }
        if (!ret) {
            LOGVRB("Plugin \"%s\" successfully loaded.", str);
            /* spends name */
            ly_add_loaded_plugin(name);
            /* keep the handler */
            ly_set_add(&dlhandlers, dlhandler, LY_SET_OPT_USEASLIST);
        } else {
            free(name);
            dlclose(dlhandler);
        }
        free(str);

        if (ret == -1) {
            /* finish on error */
            break;
        }
    }
}